

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_>::
Read(NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_> *this)

{
  TextReader<fmt::Locale> *pTVar1;
  pointer pcVar2;
  VarBoundHandler<testing::NiceMock<MockNLHandler>_> bound_handler;
  TextReader<fmt::Locale> bound_reader;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
  reader;
  VarBoundHandler<testing::NiceMock<MockNLHandler>_> local_a8;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  char *local_58;
  int local_50;
  CopyableLocale local_48 [2];
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
  local_38;
  
  if ((this->flags_ & 1) == 0) {
    Read(this,(TextReader<fmt::Locale> *)0x0);
  }
  else {
    local_a8.handler_ = this->handler_;
    local_a8.super_NullNLHandler<BasicTestExpr<0>_>.
    super_NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>._vptr_NLHandler =
         (NLHandler<mp::NullNLHandler<BasicTestExpr<0>_>,_BasicTestExpr<0>_>)
         &PTR__NLHandler_002f5598;
    pTVar1 = this->reader_;
    local_98._0_4_ = *(undefined4 *)&(pTVar1->super_ReaderBase).ptr_;
    local_98._4_4_ = *(undefined4 *)((long)&(pTVar1->super_ReaderBase).ptr_ + 4);
    local_98._8_4_ = *(undefined4 *)&(pTVar1->super_ReaderBase).start_;
    local_98._12_4_ = *(undefined4 *)((long)&(pTVar1->super_ReaderBase).start_ + 4);
    local_98._16_4_ = *(undefined4 *)&(pTVar1->super_ReaderBase).end_;
    local_98._20_4_ = *(undefined4 *)((long)&(pTVar1->super_ReaderBase).end_ + 4);
    local_98._24_4_ = *(undefined4 *)&(pTVar1->super_ReaderBase).token_;
    local_98._28_4_ = *(undefined4 *)((long)&(pTVar1->super_ReaderBase).token_ + 4);
    pcVar2 = (pTVar1->super_ReaderBase).name_._M_dataplus._M_p;
    local_78._M_p = (pointer)&local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + (pTVar1->super_ReaderBase).name_._M_string_length
              );
    local_50 = pTVar1->line_;
    local_58 = pTVar1->line_start_;
    TextReader<fmt::Locale>::CopyableLocale::CopyableLocale(local_48,&pTVar1->locale_);
    local_38.header_ = this->header_;
    local_38.flags_ = this->flags_;
    local_38.reader_ = (TextReader<fmt::Locale> *)local_98;
    local_38.num_vars_and_exprs_ = 0;
    local_38.handler_ = &local_a8;
    NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
    ::Read(&local_38,(TextReader<fmt::Locale> *)0x0);
    Read(this,(TextReader<fmt::Locale> *)local_98);
    freelocale((__locale_t)local_48[0].super_Locale.locale_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
  }
  MockNLHandler::EndInput(&this->handler_->super_MockNLHandler);
  return;
}

Assistant:

void NLReader<Reader, Handler>::Read() {
  if ((flags_ & READ_BOUNDS_FIRST) != 0) {
    // Read variable bounds first because this allows more efficient
    // problem construction.
    VarBoundHandler<Handler> bound_handler(handler_);
    Reader bound_reader(reader_);
    NLReader< Reader, VarBoundHandler<Handler> >
        reader(bound_reader, header_, bound_handler, flags_);
    reader.Read(0);
    // Read everything else.
    Read(&bound_reader);
  } else {
    Read(0);
  }
  handler_.EndInput();
}